

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entdec.c
# Opt level: O3

void od_ec_dec_init(od_ec_dec *dec,uchar *buf,uint32_t storage)

{
  dec->buf = buf;
  dec->tell_offs = -0xe;
  dec->end = buf + storage;
  dec->bptr = buf;
  dec->dif = 0x7fffffff;
  dec->rng = 0x8000;
  dec->cnt = -0xf;
  od_ec_dec_refill(dec);
  return;
}

Assistant:

void od_ec_dec_init(od_ec_dec *dec, const unsigned char *buf,
                    uint32_t storage) {
  dec->buf = buf;
  dec->tell_offs = 10 - (OD_EC_WINDOW_SIZE - 8);
  dec->end = buf + storage;
  dec->bptr = buf;
  dec->dif = ((od_ec_window)1 << (OD_EC_WINDOW_SIZE - 1)) - 1;
  dec->rng = 0x8000;
  dec->cnt = -15;
  od_ec_dec_refill(dec);
}